

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O3

int __thiscall bdQuery::printQuery(bdQuery *this)

{
  _Base_ptr p_Var1;
  FILE *pFVar2;
  uint uVar3;
  time_t tVar4;
  _List_node_base *p_Var5;
  
  tVar4 = time((time_t *)0x0);
  fwrite("Query for: ",0xb,1,_stderr);
  (*this->mFns->_vptr_bdDhtFunctions[0xb])(this->mFns,&std::cerr,this);
  fprintf(_stderr," Query State: %d",(ulong)this->mState);
  fprintf(_stderr," Query Age %ld secs",tVar4 - this->mQueryTS);
  if (2 < this->mState) {
    fprintf(_stderr," Search Time: %d secs",(ulong)(uint)this->mSearchTime);
  }
  fputc(10,_stderr);
  fwrite("Closest Available Peer: ",0x18,1,_stderr);
  p_Var1 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var1 != &(this->mClosest)._M_t._M_impl.super__Rb_tree_header) {
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,&p_Var1[1]._M_right);
    pFVar2 = _stderr;
    uVar3 = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,p_Var1 + 1);
    fprintf(pFVar2,"  Bucket: %d ",(ulong)uVar3);
    fprintf(_stderr," Flags: %x",(ulong)*(uint *)((long)&p_Var1[2]._M_right + 4));
    fprintf(_stderr," Found: %ld ago",tVar4 - (long)p_Var1[3]._M_left);
    fprintf(_stderr," LastSent: %ld ago",tVar4 - *(long *)(p_Var1 + 3));
    fprintf(_stderr," LastRecv: %ld ago",tVar4 - (long)p_Var1[3]._M_parent);
  }
  fputc(10,_stderr);
  fwrite("Closest Potential Peer: ",0x18,1,_stderr);
  p_Var1 = (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var1 != &(this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header) {
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,&p_Var1[1]._M_right);
    pFVar2 = _stderr;
    uVar3 = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,p_Var1 + 1);
    fprintf(pFVar2,"  Bucket: %d ",(ulong)uVar3);
    fprintf(_stderr," Flags: %x",(ulong)*(uint *)((long)&p_Var1[2]._M_right + 4));
    fprintf(_stderr," Found: %ld ago",tVar4 - (long)p_Var1[3]._M_left);
    fprintf(_stderr," LastSent: %ld ago",tVar4 - *(long *)(p_Var1 + 3));
    fprintf(_stderr," LastRecv: %ld ago",tVar4 - (long)p_Var1[3]._M_parent);
  }
  fputc(10,_stderr);
  fwrite("Flagged Proxies:\n",0x11,1,_stderr);
  for (p_Var5 = (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)&this->mProxiesFlagged; p_Var5 = p_Var5->_M_next) {
    fwrite("ProxyId:  ",10,1,_stderr);
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,p_Var5 + 1);
    fprintf(_stderr," Flags: %x",(ulong)*(uint *)((long)&p_Var1[2]._M_right + 4));
    fprintf(_stderr," Found: %ld ago",tVar4 - (long)p_Var5[4]._M_prev);
    fprintf(_stderr," LastSent: %ld ago",tVar4 - (long)p_Var5[3]._M_prev);
    fprintf(_stderr," LastRecv: %ld ago",tVar4 - (long)p_Var5[4]._M_next);
    fputc(10,_stderr);
  }
  fwrite("Potential Proxies:\n",0x13,1,_stderr);
  for (p_Var5 = (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)&this->mProxiesUnknown; p_Var5 = p_Var5->_M_next) {
    fwrite("ProxyId:  ",10,1,_stderr);
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,p_Var5 + 1);
    fprintf(_stderr," Flags: %x",(ulong)*(uint *)((long)&p_Var1[2]._M_right + 4));
    fprintf(_stderr," Found: %ld ago",tVar4 - (long)p_Var5[4]._M_prev);
    fprintf(_stderr," LastSent: %ld ago",tVar4 - (long)p_Var5[3]._M_prev);
    fprintf(_stderr," LastRecv: %ld ago",tVar4 - (long)p_Var5[4]._M_next);
    fputc(10,_stderr);
  }
  return 1;
}

Assistant:

int bdQuery::printQuery() {
#ifdef DEBUG_QUERY 
	fprintf(stderr, "bdQuery::printQuery()\n");
#endif
	
	time_t ts = time(NULL);
	fprintf(stderr, "Query for: ");
	mFns->bdPrintNodeId(std::cerr, &mId);
	fprintf(stderr, " Query State: %d", mState);
	fprintf(stderr, " Query Age %ld secs", ts-mQueryTS);
	if (mState >= BITDHT_QUERY_FAILURE)
		fprintf(stderr, " Search Time: %d secs", mSearchTime);
	fprintf(stderr, "\n");

#ifdef DEBUG_QUERY 
	fprintf(stderr, "Closest Available Peers:\n");
	std::multimap<bdMetric, bdPeer>::iterator it;
	for (it = mClosest.begin(); it != mClosest.end(); it++) {
		fprintf(stderr, "Id:  ");
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
		fprintf(stderr, "\n");
	}

	fprintf(stderr, "\nClosest Potential Peers:\n");
	for (it = mPotentialPeers.begin(); it != mPotentialPeers.end(); it++) {
		fprintf(stderr, "Id:  ");
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
		fprintf(stderr, "\n");
	}
#else
	// shortened version.
	fprintf(stderr, "Closest Available Peer: ");
	std::multimap<bdMetric, bdPeer>::iterator it = mClosest.begin(); 
	if (it != mClosest.end()) {
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
	}
	fprintf(stderr, "\n");

	fprintf(stderr, "Closest Potential Peer: ");
	it = mPotentialPeers.begin(); 
	if (it != mPotentialPeers.end()) {
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
	}
	fprintf(stderr, "\n");

#endif
	std::list<bdPeer>::iterator lit;
	fprintf(stderr, "Flagged Proxies:\n");
	for (lit = mProxiesFlagged.begin(); lit != mProxiesFlagged.end(); lit++) {
		fprintf(stderr, "ProxyId:  ");
		mFns->bdPrintId(std::cerr, &(lit->mPeerId));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-lit->mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-lit->mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-lit->mLastRecvTime);
		fprintf(stderr, "\n");
	}
	
	fprintf(stderr, "Potential Proxies:\n");
	for (lit = mProxiesUnknown.begin(); lit != mProxiesUnknown.end(); lit++) {
		fprintf(stderr, "ProxyId:  ");
		mFns->bdPrintId(std::cerr, &(lit->mPeerId));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-lit->mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-lit->mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-lit->mLastRecvTime);
		fprintf(stderr, "\n");
	}

	return 1;
}